

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::get
          (FieldGeneratorMap *this,FieldDescriptor *field)

{
  LogMessage *other;
  long *plVar1;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *psVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cpp/cpp_field.cc"
               ,0x86);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (field[0x34] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x38) + 0x30);
  }
  else if (*(long *)(field + 0x40) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x20) + 0x80);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x40) + 0x70);
  }
  psVar2 = internal::
           scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
           ::operator[](&this->field_generators_,
                        (long)((int)((ulong)((long)field - *plVar1) >> 3) * -0x11111111));
  if (psVar2->ptr_ != (FieldGenerator *)0x0) {
    return psVar2->ptr_;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1de,
                "C &google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::operator*() const [C = google::protobuf::compiler::cpp::FieldGenerator]"
               );
}

Assistant:

const FieldGenerator& FieldGeneratorMap::get(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}